

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O1

ikcpcb * ikcp_create(IUINT32 conv,void *user)

{
  ikcpcb *__ptr;
  char *pcVar1;
  
  if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
    __ptr = (ikcpcb *)malloc(0x110);
  }
  else {
    __ptr = (ikcpcb *)(*ikcp_malloc_hook)(0x110);
  }
  if (__ptr != (ikcpcb *)0x0) {
    __ptr->conv = conv;
    __ptr->user = user;
    __ptr->ts_probe = 0;
    __ptr->probe_wait = 0;
    __ptr->snd_una = 0;
    __ptr->snd_nxt = 0;
    __ptr->rcv_nxt = 0;
    __ptr->ts_recent = 0;
    __ptr->ts_lastack = 0;
    __ptr->snd_wnd = 0x20;
    __ptr->rcv_wnd = 0x80;
    __ptr->rmt_wnd = 0x80;
    __ptr->cwnd = 0;
    __ptr->incr = 0;
    __ptr->probe = 0;
    __ptr->mtu = 0x578;
    __ptr->mss = 0x560;
    __ptr->stream = 0;
    if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
      pcVar1 = (char *)malloc(0x10b0);
    }
    else {
      pcVar1 = (char *)(*ikcp_malloc_hook)(0x10b0);
    }
    __ptr->buffer = pcVar1;
    if (pcVar1 != (char *)0x0) {
      (__ptr->snd_queue).next = &__ptr->snd_queue;
      (__ptr->snd_queue).prev = &__ptr->snd_queue;
      (__ptr->rcv_queue).next = &__ptr->rcv_queue;
      (__ptr->rcv_queue).prev = &__ptr->rcv_queue;
      (__ptr->snd_buf).next = &__ptr->snd_buf;
      (__ptr->snd_buf).prev = &__ptr->snd_buf;
      (__ptr->rcv_buf).next = &__ptr->rcv_buf;
      (__ptr->rcv_buf).prev = &__ptr->rcv_buf;
      __ptr->state = 0;
      __ptr->rx_rttval = 0;
      __ptr->rx_srtt = 0;
      __ptr->nrcv_buf = 0;
      __ptr->nsnd_buf = 0;
      __ptr->nrcv_que = 0;
      __ptr->nsnd_que = 0;
      __ptr->acklist = (IUINT32 *)0x0;
      __ptr->ackcount = 0;
      __ptr->ackblock = 0;
      __ptr->rx_rto = 200;
      __ptr->rx_minrto = 100;
      __ptr->current = 0;
      __ptr->interval = 100;
      __ptr->ts_flush = 100;
      __ptr->nodelay = 0;
      __ptr->updated = 0;
      __ptr->logmask = 0;
      __ptr->ssthresh = 2;
      __ptr->fastresend = 0;
      __ptr->fastlimit = 5;
      __ptr->nocwnd = 0;
      __ptr->xmit = 0;
      __ptr->dead_link = 0x14;
      __ptr->output = (_func_int_char_ptr_int_IKCPCB_ptr_void_ptr *)0x0;
      __ptr->writelog = (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0;
      return __ptr;
    }
    if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
      free(__ptr);
    }
    else {
      (*ikcp_free_hook)(__ptr);
    }
  }
  return (ikcpcb *)0x0;
}

Assistant:

ikcpcb* ikcp_create(IUINT32 conv, void *user)
{
	ikcpcb *kcp = (ikcpcb*)ikcp_malloc(sizeof(struct IKCPCB));
	if (kcp == NULL) return NULL;
	kcp->conv = conv;
	kcp->user = user;
	kcp->snd_una = 0;
	kcp->snd_nxt = 0;
	kcp->rcv_nxt = 0;
	kcp->ts_recent = 0;
	kcp->ts_lastack = 0;
	kcp->ts_probe = 0;
	kcp->probe_wait = 0;
	kcp->snd_wnd = IKCP_WND_SND;
	kcp->rcv_wnd = IKCP_WND_RCV;
	kcp->rmt_wnd = IKCP_WND_RCV;
	kcp->cwnd = 0;
	kcp->incr = 0;
	kcp->probe = 0;
	kcp->mtu = IKCP_MTU_DEF;
	kcp->mss = kcp->mtu - IKCP_OVERHEAD;
	kcp->stream = 0;

	kcp->buffer = (char*)ikcp_malloc((kcp->mtu + IKCP_OVERHEAD) * 3);
	if (kcp->buffer == NULL) {
		ikcp_free(kcp);
		return NULL;
	}

	iqueue_init(&kcp->snd_queue);
	iqueue_init(&kcp->rcv_queue);
	iqueue_init(&kcp->snd_buf);
	iqueue_init(&kcp->rcv_buf);
	kcp->nrcv_buf = 0;
	kcp->nsnd_buf = 0;
	kcp->nrcv_que = 0;
	kcp->nsnd_que = 0;
	kcp->state = 0;
	kcp->acklist = NULL;
	kcp->ackblock = 0;
	kcp->ackcount = 0;
	kcp->rx_srtt = 0;
	kcp->rx_rttval = 0;
	kcp->rx_rto = IKCP_RTO_DEF;
	kcp->rx_minrto = IKCP_RTO_MIN;
	kcp->current = 0;
	kcp->interval = IKCP_INTERVAL;
	kcp->ts_flush = IKCP_INTERVAL;
	kcp->nodelay = 0;
	kcp->updated = 0;
	kcp->logmask = 0;
	kcp->ssthresh = IKCP_THRESH_INIT;
	kcp->fastresend = 0;
	kcp->fastlimit = IKCP_FASTACK_LIMIT;
	kcp->nocwnd = 0;
	kcp->xmit = 0;
	kcp->dead_link = IKCP_DEADLINK;
	kcp->output = NULL;
	kcp->writelog = NULL;

	return kcp;
}